

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Quaternion pbrt::Slerp(Float t,Quaternion *q1,Quaternion *q2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var_01 [60];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uVar20;
  Quaternion QVar21;
  float fVar15;
  
  fVar10 = (q1->v).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar15 = (q1->v).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (q2->v).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar2 = (q2->v).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar2)),ZEXT416((uint)fVar10),
                            ZEXT416((uint)fVar1));
  fVar3 = (q1->v).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar4 = (q2->v).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar3),ZEXT416((uint)fVar4));
  fVar11 = q1->w;
  fVar5 = q2->w;
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar11),ZEXT416((uint)fVar5));
  if (0.0 <= auVar14._0_4_) {
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)((fVar2 - fVar15) * (fVar2 - fVar15))),
                              ZEXT416((uint)(fVar1 - fVar10)),ZEXT416((uint)(fVar1 - fVar10)));
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)(fVar4 - fVar3)),ZEXT416((uint)(fVar4 - fVar3)))
    ;
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)(fVar5 - fVar11)),
                              ZEXT416((uint)(fVar5 - fVar11)));
    if (auVar14._0_4_ < 0.0) {
      fVar10 = sqrtf(auVar14._0_4_);
    }
    else {
      auVar14 = vsqrtss_avx(auVar14,auVar14);
      fVar10 = auVar14._0_4_;
    }
    auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar10 * 0.5)));
    uVar6 = vcmpss_avx512f(ZEXT416((uint)(fVar10 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar6 & 1);
    fVar10 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar14._0_4_));
    auVar17 = ZEXT464((uint)(fVar10 + fVar10));
  }
  else {
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)((fVar15 + fVar2) * (fVar15 + fVar2))),
                              ZEXT416((uint)(fVar10 + fVar1)),ZEXT416((uint)(fVar10 + fVar1)));
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)(fVar3 + fVar4)),ZEXT416((uint)(fVar3 + fVar4)))
    ;
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)(fVar5 + fVar11)),
                              ZEXT416((uint)(fVar5 + fVar11)));
    if (auVar14._0_4_ < 0.0) {
      fVar10 = sqrtf(auVar14._0_4_);
    }
    else {
      auVar14 = vsqrtss_avx(auVar14,auVar14);
      fVar10 = auVar14._0_4_;
    }
    auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar10 * 0.5)));
    uVar6 = vcmpss_avx512f(ZEXT416((uint)(fVar10 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar6 & 1);
    auVar17._0_4_ = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar14._0_4_));
    auVar17._4_60_ = extraout_var_01;
    auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar17._0_16_,ZEXT416(0x40490fdb));
    auVar17 = ZEXT1664(auVar14);
  }
  auVar18 = SUB6416(ZEXT464(0x3f800000),0);
  auVar14 = vfmadd213ss_fma(auVar17._0_16_,auVar17._0_16_,auVar18);
  if ((auVar14._0_4_ != 1.0) || (NAN(auVar14._0_4_))) {
    fVar15 = auVar17._0_4_;
    fVar10 = sinf(fVar15);
    auVar17 = ZEXT464((uint)fVar15);
    auVar18._0_4_ = fVar10 / fVar15;
    auVar18._4_12_ = extraout_var;
  }
  fVar15 = 1.0 - t;
  fVar1 = (q1->v).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar2 = (q1->v).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar3 = (q1->v).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar4 = q1->w;
  fVar10 = fVar15 * auVar17._0_4_;
  auVar19 = SUB6416(ZEXT464(0x3f800000),0);
  auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),auVar19);
  if ((auVar14._0_4_ != 1.0) || (NAN(auVar14._0_4_))) {
    fVar11 = sinf(fVar10);
    auVar19._0_4_ = fVar11 / fVar10;
    auVar19._4_12_ = extraout_var_00;
  }
  fVar12 = 1.0;
  fVar11 = (q2->v).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar5 = (q2->v).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar8 = (q2->v).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar9 = q2->w;
  fVar10 = auVar17._0_4_ * t;
  auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),
                            SUB6416(ZEXT464(0x3f800000),0));
  if ((auVar14._0_4_ != 1.0) || (NAN(auVar14._0_4_))) {
    fVar12 = sinf(fVar10);
    fVar12 = fVar12 / fVar10;
  }
  fVar10 = auVar19._0_4_;
  auVar14._0_4_ = fVar15 * fVar1 * fVar10;
  auVar14._4_4_ = fVar15 * fVar2 * fVar10;
  auVar14._8_4_ = fVar15 * fVar3 * fVar10;
  auVar14._12_4_ = fVar15 * fVar4 * fVar10;
  uVar20 = auVar18._0_4_;
  auVar16._4_4_ = uVar20;
  auVar16._0_4_ = uVar20;
  auVar16._8_4_ = uVar20;
  auVar16._12_4_ = uVar20;
  auVar14 = vdivps_avx(auVar14,auVar16);
  auVar13._0_4_ = fVar11 * t * fVar12;
  auVar13._4_4_ = fVar5 * t * fVar12;
  auVar13._8_4_ = fVar8 * t * fVar12;
  auVar13._12_4_ = fVar9 * t * fVar12;
  auVar18 = vdivps_avx(auVar13,auVar16);
  fVar10 = auVar14._0_4_ + auVar18._0_4_;
  fVar15 = auVar14._4_4_ + auVar18._4_4_;
  auVar14 = CONCAT412(auVar14._12_4_ + auVar18._12_4_,
                      CONCAT48(auVar14._8_4_ + auVar18._8_4_,CONCAT44(fVar15,fVar10)));
  auVar14 = vshufpd_avx(auVar14,auVar14,1);
  QVar21._8_8_ = auVar14._0_8_;
  QVar21.v.super_Tuple3<pbrt::Vector3,_float>.x = fVar10;
  QVar21.v.super_Tuple3<pbrt::Vector3,_float>.y = fVar15;
  return QVar21;
}

Assistant:

PBRT_CPU_GPU
inline Quaternion Slerp(Float t, const Quaternion &q1, const Quaternion &q2) {
    Float theta = AngleBetween(q1, q2);
    Float sinThetaOverTheta = SinXOverX(theta);
    return q1 * (1 - t) * SinXOverX((1 - t) * theta) / sinThetaOverTheta +
           q2 * t * SinXOverX(t * theta) / sinThetaOverTheta;
}